

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reporter.cc
# Opt level: O3

void benchmark::BenchmarkReporter::PrintBasicContext(ostream *out_ptr,Context *context)

{
  ostream *poVar1;
  char *pcVar2;
  CheckHandler local_40;
  char *local_38;
  long local_30;
  char local_28 [16];
  
  if (out_ptr == (ostream *)0x0) {
    internal::CheckHandler::CheckHandler
              (&local_40,"out_ptr",
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/reporter.cc"
               ,"PrintBasicContext",0x27);
  }
  else {
    local_40.log_ = internal::GetNullLogInstance();
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_40.log_,"cannot be null",0xe);
  if (out_ptr != (ostream *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(out_ptr,"Run on (",8);
    poVar1 = (ostream *)std::ostream::operator<<(out_ptr,context->num_cpus);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," X ",3);
    poVar1 = std::ostream::_M_insert<double>(context->mhz_per_cpu);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," MHz CPU ",9);
    pcVar2 = "";
    if (1 < context->num_cpus) {
      pcVar2 = "s";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar2,(ulong)(1 < context->num_cpus))
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")\n",2);
    LocalDateTimeString_abi_cxx11_();
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(out_ptr,local_38,local_30);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    if (local_38 != local_28) {
      operator_delete(local_38);
    }
    if (context->cpu_scaling_enabled == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                (out_ptr,
                 "***WARNING*** CPU scaling is enabled, the benchmark real time measurements may be noisy and will incur extra overhead.\n"
                 ,0x77);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (out_ptr,"***WARNING*** Library was built as DEBUG. Timings may be affected.\n",0x43);
    return;
  }
  internal::CheckHandler::~CheckHandler(&local_40);
}

Assistant:

void BenchmarkReporter::PrintBasicContext(std::ostream *out_ptr,
                                          Context const &context) {
  CHECK(out_ptr) << "cannot be null";
  auto& Out = *out_ptr;

  Out << "Run on (" << context.num_cpus << " X " << context.mhz_per_cpu
            << " MHz CPU " << ((context.num_cpus > 1) ? "s" : "") << ")\n";

  Out << LocalDateTimeString() << "\n";

  if (context.cpu_scaling_enabled) {
    Out << "***WARNING*** CPU scaling is enabled, the benchmark "
                 "real time measurements may be noisy and will incur extra "
                 "overhead.\n";
  }

#ifndef NDEBUG
  Out << "***WARNING*** Library was built as DEBUG. Timings may be "
               "affected.\n";
#endif
}